

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall
booster::callback<void_(const_std::error_code_&,_unsigned_long)>::callback<cancel_once>
          (callback<void_(const_std::error_code_&,_unsigned_long)> *this,cancel_once func)

{
  callable_impl<void,_cancel_once> *this_00;
  
  this_00 = (callable_impl<void,_cancel_once> *)operator_new(0x20);
  callable_impl<void,_cancel_once>::callable_impl(this_00,func);
  (this->call_ptr).p_ = (callable<void_(const_std::error_code_&,_unsigned_long)> *)this_00;
  booster::atomic_counter::inc();
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}